

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O3

mdef_t * mdef_init(char *mdeffile,int32 breport)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  s3senid_t *psVar5;
  undefined8 uVar6;
  glist_t pgVar7;
  s3cipid_t sVar8;
  int iVar9;
  int iVar10;
  mdef_t *pmVar11;
  FILE *__stream;
  char *pcVar12;
  hash_table_t *phVar13;
  ciphone_t *pcVar14;
  phone_t *ppVar15;
  s3senid_t **ppsVar16;
  s3senid_t *psVar17;
  ph_lc_t ***ppppVar18;
  char *pcVar19;
  s3cipid_t *__s;
  void *pvVar20;
  glist_t g;
  int32 iVar21;
  ulong uVar22;
  s3cipid_t *psVar23;
  word_posn_t wpos;
  long lVar24;
  uint uVar25;
  uint size;
  uint uVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  void *val;
  s3pid_t p;
  undefined1 auVar31 [16];
  int32 wlen;
  int32 n;
  char buf [1024];
  void *id;
  char tag [1024];
  undefined4 uVar32;
  int local_c6c;
  mdef_t *local_c68;
  hash_table_t *local_c60;
  uint local_c58;
  s3cipid_t local_c54;
  s3cipid_t local_c52;
  long local_c50;
  uint local_c44;
  char *local_c40;
  char local_c38 [1024];
  undefined8 local_838;
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  
  if (mdeffile == (char *)0x0) {
    pcVar12 = "No mdef-file\n";
    lVar24 = 0x2a8;
LAB_00115ae9:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
            ,lVar24,pcVar12);
  }
  else {
    if (breport != 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
              ,0x2ab,"Reading model definition: %s\n",mdeffile);
    }
    pmVar11 = (mdef_t *)
              __ckd_calloc__(1,0x68,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                             ,0x2ad);
    __stream = fopen(mdeffile,"r");
    if (__stream == (FILE *)0x0) {
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                     ,0x2b0,"fopen(%s,r) failed\n",mdeffile);
      goto LAB_00115b5c;
    }
    do {
      pcVar12 = fgets(local_c38,0x400,__stream);
      if (pcVar12 == (char *)0x0) {
        pcVar12 = "Empty file: %s\n";
        lVar24 = 0x2b3;
        goto LAB_00115b31;
      }
    } while (local_c38[0] == '#');
    local_c60 = (hash_table_t *)mdeffile;
    if (local_c38[2] != '3' || (short)local_c38._0_4_ != 0x2e30) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
              ,0x2b7,"Version error: Expecing %s, but read %s\n","0.3",local_c38);
      goto LAB_00115b5c;
    }
    pmVar11->n_ci_sen = -1;
    pmVar11->n_sen = -1;
    pmVar11->n_tmat = -1;
    local_c68 = pmVar11;
    uVar28 = 0xffffffff;
    uVar30 = 0xffffffff;
    uVar25 = 0xffffffff;
    do {
      do {
        do {
          pcVar12 = fgets(local_c38,0x400,__stream);
          if (pcVar12 == (char *)0x0) {
            pcVar12 = "Incomplete header\n";
            lVar24 = 0x2c2;
            goto LAB_00115ae9;
          }
        } while (local_c38[0] == '#');
        iVar9 = __isoc99_sscanf(local_c38,"%d %s",&local_c44,&local_438);
        pmVar11 = local_c68;
        if ((iVar9 != 2) || ((int)local_c44 < 0)) {
          pcVar12 = "Error in header: %s\n";
          mdeffile = local_c38;
          lVar24 = 0x2c5;
          goto LAB_00115b31;
        }
        size = local_c44;
        uVar26 = uVar30;
        uVar29 = uVar28;
        if (((CONCAT13(cStack_432,CONCAT12(cStack_433,CONCAT11(cStack_434,cStack_435))) != 0x657361
              || CONCAT13(cStack_435,CONCAT12(cStack_436,CONCAT11(cStack_437,local_438))) !=
                 0x61625f6e) &&
            (size = uVar25, uVar26 = local_c44,
            CONCAT11(cStack_433,cStack_434) != 0x69 ||
            CONCAT13(cStack_435,CONCAT12(cStack_436,CONCAT11(cStack_437,local_438))) != 0x72745f6e))
           && (uVar26 = uVar30, uVar29 = local_c44,
              CONCAT13(cStack_42d,CONCAT12(cStack_42e,CONCAT11(cStack_42f,cStack_430))) != 0x70616d
              || CONCAT17(cStack_431,
                          CONCAT16(cStack_432,
                                   CONCAT15(cStack_433,
                                            CONCAT14(cStack_434,
                                                     CONCAT13(cStack_435,
                                                              CONCAT12(cStack_436,
                                                                       CONCAT11(cStack_437,local_438
                                                                               ))))))) !=
                 0x5f65746174735f6e)) {
          auVar31[0] = -(local_438 == 'n');
          auVar31[1] = -(cStack_437 == '_');
          auVar31[2] = -(cStack_436 == 't');
          auVar31[3] = -(cStack_435 == 'i');
          auVar31[4] = -(cStack_434 == 'e');
          auVar31[5] = -(cStack_433 == 'd');
          auVar31[6] = -(cStack_432 == '_');
          auVar31[7] = -(cStack_431 == 'c');
          auVar31[8] = -(cStack_430 == 'i');
          auVar31[9] = -(cStack_42f == '_');
          auVar31[10] = -(cStack_42e == 's');
          auVar31[0xb] = -(cStack_42d == 't');
          auVar31[0xc] = -(cStack_42c == 'a');
          auVar31[0xd] = -(cStack_42b == 't');
          auVar31[0xe] = -(cStack_42a == 'e');
          auVar31[0xf] = -(cStack_429 == '\0');
          if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar31[0xf] >> 7) << 0xf) == 0xffff) {
            local_c68->n_ci_sen = local_c44;
            uVar29 = uVar28;
          }
          else if (CONCAT17(cStack_42c,
                            CONCAT16(cStack_42d,
                                     CONCAT15(cStack_42e,
                                              CONCAT14(cStack_42f,
                                                       CONCAT13(cStack_430,
                                                                CONCAT12(cStack_431,
                                                                         CONCAT11(cStack_432,
                                                                                  cStack_433)))))))
                   == 0x65746174735f64 &&
                   CONCAT17(cStack_431,
                            CONCAT16(cStack_432,
                                     CONCAT15(cStack_433,
                                              CONCAT14(cStack_434,
                                                       CONCAT13(cStack_435,
                                                                CONCAT12(cStack_436,
                                                                         CONCAT11(cStack_437,
                                                                                  local_438)))))))
                   == 0x735f646569745f6e) {
            local_c68->n_sen = local_c44;
            uVar29 = uVar28;
          }
          else {
            if (CONCAT13(cStack_42d,CONCAT12(cStack_42e,CONCAT11(cStack_42f,cStack_430))) !=
                0x74616d ||
                CONCAT17(cStack_431,
                         CONCAT16(cStack_432,
                                  CONCAT15(cStack_433,
                                           CONCAT14(cStack_434,
                                                    CONCAT13(cStack_435,
                                                             CONCAT12(cStack_436,
                                                                      CONCAT11(cStack_437,local_438)
                                                                     )))))) != 0x745f646569745f6e) {
              pcVar12 = "Unknown header line: %s\n";
              mdeffile = local_c38;
              lVar24 = 0x2d4;
              goto LAB_00115b31;
            }
            local_c68->n_tmat = local_c44;
            uVar29 = uVar28;
          }
        }
        uVar28 = uVar29;
        uVar30 = uVar26;
        uVar25 = size;
      } while (((int)(size | uVar26 | uVar29) < 0) || (uVar2 = local_c68->n_ci_sen, (int)uVar2 < 0))
      ;
      uVar3 = local_c68->n_sen;
      uVar22 = (ulong)uVar3;
    } while (((int)uVar3 < 0) || (uVar4 = local_c68->n_tmat, (int)uVar4 < 0));
    if ((((uVar3 < uVar2) || (size == 0)) || (uVar2 == 0)) || (uVar4 == 0)) {
      pcVar12 = "%s: Error in header\n";
      lVar24 = 0x2da;
      mdeffile = (char *)local_c60;
LAB_00115b31:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
              ,lVar24,pcVar12,mdeffile);
      goto LAB_00115b5c;
    }
    if (size < 0x7fff) {
      uVar26 = uVar26 + size;
      if (uVar26 < 0x7ffffffe) {
        if (uVar3 < 0x7ffe) {
          if (uVar4 < 0x7ffffffe) {
            local_c68->n_emit_state = uVar29 / uVar26 - 1;
            if ((uVar29 / uVar26) * uVar26 == uVar29) {
              local_c68->n_ciphone = size;
              phVar13 = hash_table_new(size,0);
              pmVar11->ciphone_ht = phVar13;
              local_c40 = (char *)(ulong)size;
              local_c58 = size;
              pcVar14 = (ciphone_t *)
                        __ckd_calloc__((size_t)local_c40,0x10,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                       ,0x2f2);
              pmVar11->ciphone = pcVar14;
              pmVar11->n_phone = uVar26;
              ppVar15 = (phone_t *)
                        __ckd_calloc__((ulong)uVar26,0x20,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                       ,0x2f6);
              pmVar11->phone = ppVar15;
              ppsVar16 = (s3senid_t **)
                         __ckd_calloc_2d__((long)pmVar11->n_phone,(long)pmVar11->n_emit_state,2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                           ,0x2f9);
              pmVar11->sseq = ppsVar16;
              psVar17 = (s3senid_t *)
                        __ckd_calloc__((long)pmVar11->n_emit_state * (long)pmVar11->n_phone,2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                       ,0x30d);
              pmVar11->st2senmap = psVar17;
              iVar9 = pmVar11->n_phone;
              if (0 < (long)iVar9) {
                iVar10 = pmVar11->n_emit_state;
                ppVar15 = pmVar11->phone;
                lVar24 = 0;
                do {
                  *(s3senid_t **)((long)&ppVar15->state + lVar24) = psVar17;
                  psVar17 = psVar17 + iVar10;
                  lVar24 = lVar24 + 0x20;
                } while ((long)iVar9 * 0x20 != lVar24);
              }
              ppppVar18 = (ph_lc_t ***)
                          __ckd_calloc_2d__(4,(long)pmVar11->n_ciphone,8,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                            ,0x314);
              pmVar11->wpos_ci_lclist = ppppVar18;
              pcVar12 = (char *)0x0;
              do {
                do {
                  pcVar19 = fgets(local_c38,0x400,__stream);
                  if (pcVar19 == (char *)0x0) {
                    pcVar19 = "Premature EOF reading CIphone %d\n";
                    lVar24 = 0x31e;
                    uVar22 = (ulong)pcVar12 & 0xffffffff;
                    goto LAB_00115b55;
                  }
                } while (local_c38[0] == '#');
                local_c60 = (hash_table_t *)pcVar12;
                iVar9 = __isoc99_sscanf(local_c38,"%s%n",&local_838,&local_c6c);
                if (iVar9 != 1) {
                  pcVar12 = "Missing base phone name: %s\n";
                  mdeffile = local_c38;
                  lVar24 = 0x1ea;
                  goto LAB_00115b31;
                }
                local_c50 = (long)local_c6c;
                sVar8 = mdef_ciphone_id(pmVar11,(char *)&local_838);
                phVar13 = local_c60;
                if (-1 < sVar8) {
                  pcVar12 = "Duplicate base phone: %s\n";
                  mdeffile = local_c38;
                  lVar24 = 0x1f0;
                  goto LAB_00115b31;
                }
                if ((long)pmVar11->n_ciphone <= (long)local_c60) {
                  __assert_fail("p < m->n_ciphone",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                ,0xad,"void ciphone_add(mdef_t *, const char *, s3pid_t)");
                }
                pcVar12 = __ckd_salloc__((char *)&local_838,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                         ,0xaf);
                pmVar11->ciphone[(long)phVar13].name = pcVar12;
                pcVar12 = (char *)hash_table_enter(pmVar11->ciphone_ht,pcVar12,phVar13);
                if ((hash_table_t *)pcVar12 != phVar13) {
                  mdeffile = local_c68->ciphone[(long)phVar13].name;
                  pcVar12 = "hash_table_enter(%s) failed; duplicate CIphone?\n";
                  lVar24 = 0xb2;
                  goto LAB_00115b31;
                }
                pcVar12 = local_c38 + local_c50;
                iVar9 = 3;
                do {
                  iVar10 = __isoc99_sscanf(pcVar12,"%s%n",&local_838,&local_c6c);
                  if ((iVar10 != 1) || (CONCAT11(local_838._1_1_,(byte)local_838) != 0x2d)) {
                    pcVar12 = "Bad context info for base phone: %s\n";
                    mdeffile = local_c38;
                    lVar24 = 0x1fa;
                    goto LAB_00115b31;
                  }
                  pcVar12 = pcVar12 + local_c6c;
                  iVar9 = iVar9 + -1;
                } while (iVar9 != 0);
                iVar9 = __isoc99_sscanf(pcVar12,"%s%n",&local_838,&local_c6c);
                phVar13 = local_c60;
                if (iVar9 != 1) {
                  pcVar12 = "Missing filler atribute field: %s\n";
                  mdeffile = local_c38;
                  lVar24 = 0x200;
                  goto LAB_00115b31;
                }
                if (local_838._3_4_ == 0x72656c &&
                    CONCAT13(local_838._3_1_,
                             CONCAT12(local_838._2_1_,CONCAT11(local_838._1_1_,(byte)local_838))) ==
                    0x6c6c6966) {
                  iVar21 = 1;
                }
                else {
                  iVar21 = 0;
                  if (CONCAT13(local_838._3_1_,
                               CONCAT12(local_838._2_1_,CONCAT11(local_838._1_1_,(byte)local_838)))
                      != 0x612f6e) {
                    pcVar12 = "Bad filler attribute field: %s\n";
                    mdeffile = local_c38;
                    lVar24 = 0x207;
                    goto LAB_00115b31;
                  }
                }
                local_c68->ciphone[(short)local_c60].filler = iVar21;
                iVar9 = (int)pcVar12 + local_c6c;
                p = (s3pid_t)local_c60;
                triphone_add(local_c68,(short)local_c60,-1,-1,WORD_POSN_UNDEFINED,p);
                pmVar11 = local_c68;
                parse_tmat_senmap(local_c68,local_c38,iVar9 - (int)local_c38,p);
                pcVar12 = (char *)((long)phVar13 + 1);
              } while (pcVar12 != local_c40);
              iVar21 = hash_table_lookup(pmVar11->ciphone_ht,"SIL",(void **)&local_838);
              sVar8 = -1;
              if (-1 < iVar21) {
                sVar8 = CONCAT11(local_838._1_1_,(byte)local_838);
              }
              pmVar11->sil = sVar8;
              if ((int)local_c58 < pmVar11->n_phone) {
                uVar22 = (ulong)local_c58;
                do {
                  do {
                    pcVar12 = fgets(local_c38,0x400,__stream);
                    if (pcVar12 == (char *)0x0) {
                      pcVar19 = "Premature EOF reading phone %d\n";
                      lVar24 = 0x326;
LAB_00115b55:
                      err_msg(ERR_FATAL,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                              ,lVar24,pcVar19,uVar22);
                      goto LAB_00115b5c;
                    }
                  } while (local_c38[0] == '#');
                  iVar9 = __isoc99_sscanf(local_c38,"%s%n",&local_838,&local_c6c);
                  if (iVar9 != 1) {
                    pcVar12 = "Missing base phone name: %s\n";
                    mdeffile = local_c38;
                    lVar24 = 0x21d;
                    goto LAB_00115b31;
                  }
                  lVar24 = (long)local_c6c;
                  sVar8 = mdef_ciphone_id(pmVar11,(char *)&local_838);
                  local_c50 = CONCAT62(local_c50._2_6_,sVar8);
                  if (sVar8 < 0) {
                    pcVar12 = "Unknown base phone: %s\n";
                    mdeffile = local_c38;
                    lVar24 = 0x222;
                    goto LAB_00115b31;
                  }
                  local_c60 = (hash_table_t *)CONCAT44(local_c60._4_4_,(int)uVar22);
                  pcVar12 = local_c38 + lVar24;
                  iVar9 = __isoc99_sscanf(pcVar12,"%s%n",&local_838,&local_c6c);
                  if (iVar9 != 1) {
                    pcVar12 = "Missing left context: %s\n";
                    mdeffile = local_c38;
                    lVar24 = 0x226;
                    goto LAB_00115b31;
                  }
                  lVar24 = (long)local_c6c;
                  sVar8 = mdef_ciphone_id(pmVar11,(char *)&local_838);
                  if (sVar8 < 0) {
                    pcVar12 = "Unknown left context: %s\n";
                    mdeffile = local_c38;
                    lVar24 = 0x22a;
                    goto LAB_00115b31;
                  }
                  pcVar12 = pcVar12 + lVar24;
                  local_c52 = sVar8;
                  iVar9 = __isoc99_sscanf(pcVar12,"%s%n",&local_838,&local_c6c);
                  if (iVar9 != 1) {
                    pcVar12 = "Missing right context: %s\n";
                    mdeffile = local_c38;
                    lVar24 = 0x22e;
                    goto LAB_00115b31;
                  }
                  lVar24 = (long)local_c6c;
                  sVar8 = mdef_ciphone_id(local_c68,(char *)&local_838);
                  iVar9 = (int)local_c60;
                  if (sVar8 < 0) {
                    pcVar12 = "Unknown right  context: %s\n";
                    mdeffile = local_c38;
                    lVar24 = 0x232;
                    goto LAB_00115b31;
                  }
                  pcVar12 = pcVar12 + lVar24;
                  iVar10 = __isoc99_sscanf(pcVar12,"%s%n",&local_838,&local_c6c);
                  pmVar11 = local_c68;
                  if ((iVar10 != 1) || (local_838._1_1_ != '\0')) {
                    pcVar12 = "Missing or bad word-position spec: %s\n";
                    mdeffile = local_c38;
                    lVar24 = 0x236;
                    goto LAB_00115b31;
                  }
                  lVar24 = (long)local_c6c;
                  local_c54 = sVar8;
                  if ((byte)local_838 < 0x69) {
                    wpos = WORD_POSN_BEGIN;
                    if ((byte)local_838 != 0x62) {
                      if ((byte)local_838 != 0x65) {
LAB_00115d77:
                        pcVar12 = "Bad word-position spec: %s\n";
                        mdeffile = local_c38;
                        lVar24 = 0x246;
                        goto LAB_00115b31;
                      }
                      wpos = WORD_POSN_END;
                    }
                  }
                  else if ((byte)local_838 == 0x69) {
                    wpos = WORD_POSN_INTERNAL;
                  }
                  else {
                    if ((byte)local_838 != 0x73) goto LAB_00115d77;
                    wpos = WORD_POSN_SINGLE;
                  }
                  iVar10 = __isoc99_sscanf(pcVar12 + lVar24,"%s%n",&local_838,&local_c6c);
                  if (iVar10 != 1) {
                    pcVar12 = "Missing filler attribute field: %s\n";
                    mdeffile = local_c38;
                    lVar24 = 0x24b;
                    goto LAB_00115b31;
                  }
                  if (((local_838._3_4_ != 0x72656c ||
                        CONCAT13(local_838._3_1_,
                                 CONCAT12(local_838._2_1_,CONCAT11(local_838._1_1_,(byte)local_838))
                                ) != 0x6c6c6966) ||
                      (pmVar11->ciphone[(uint)(int)(short)local_c50].filler == 0)) &&
                     ((CONCAT13(local_838._3_1_,
                                CONCAT12(local_838._2_1_,CONCAT11(local_838._1_1_,(byte)local_838)))
                       != 0x612f6e || (pmVar11->ciphone[(uint)(int)(short)local_c50].filler != 0))))
                  {
                    pcVar12 = "Bad filler attribute field: %s\n";
                    mdeffile = local_c38;
                    lVar24 = 0x252;
                    goto LAB_00115b31;
                  }
                  iVar10 = (int)(pcVar12 + lVar24) + local_c6c;
                  triphone_add(pmVar11,(short)local_c50,local_c52,local_c54,wpos,iVar9);
                  parse_tmat_senmap(pmVar11,local_c38,iVar10 - (int)local_c38,iVar9);
                  uVar22 = (ulong)(iVar9 + 1U);
                } while ((int)(iVar9 + 1U) < pmVar11->n_phone);
              }
              do {
                pcVar12 = fgets(local_c38,0x400,__stream);
                if (pcVar12 == (char *)0x0) goto LAB_0011589c;
              } while (local_c38[0] == '#');
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                      ,0x32c,"Non-empty file beyond expected #phones (%d)\n",
                      (ulong)(uint)pmVar11->n_phone);
LAB_0011589c:
              if (pmVar11->n_emit_state * pmVar11->n_ciphone == pmVar11->n_ci_sen) {
                psVar17 = (s3senid_t *)
                          __ckd_calloc__((long)pmVar11->n_sen,2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                         ,0x333);
                pmVar11->cd2cisen = psVar17;
                __s = (s3cipid_t *)
                      __ckd_calloc__((long)pmVar11->n_sen,2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                     ,0x335);
                pmVar11->sen2cimap = __s;
                if (0 < pmVar11->n_sen) {
                  memset(__s,0xff,(ulong)(uint)pmVar11->n_sen * 2);
                }
                iVar9 = pmVar11->n_ci_sen;
                uVar28 = pmVar11->n_emit_state;
                if (0 < (long)iVar9) {
                  psVar17 = local_c68->cd2cisen;
                  uVar22 = 0;
                  do {
                    psVar17[uVar22] = (s3senid_t)uVar22;
                    __s[uVar22] = (s3cipid_t)
                                  ((long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 |
                                         uVar22 & 0xffffffff) / (long)(int)uVar28);
                    uVar22 = uVar22 + 1;
                  } while ((long)iVar9 != uVar22);
                }
                iVar21 = local_c68->n_phone;
                pcVar12 = local_c40;
                uVar30 = local_c58;
                while ((int)uVar30 < iVar21) {
                  if (0 < (int)uVar28) {
                    ppsVar16 = local_c68->sseq;
                    psVar17 = ppsVar16[(long)pcVar12];
                    psVar23 = &local_c68->phone[(long)pcVar12].ci;
                    psVar5 = local_c68->cd2cisen;
                    sVar8 = *psVar23;
                    uVar22 = 0;
                    do {
                      sVar1 = psVar17[uVar22];
                      psVar5[sVar1] = ppsVar16[sVar8][uVar22];
                      sVar8 = *psVar23;
                      __s[sVar1] = sVar8;
                      uVar22 = uVar22 + 1;
                    } while (uVar28 != uVar22);
                  }
                  pcVar12 = pcVar12 + 1;
                  uVar30 = (uint)pcVar12;
                }
                uVar30 = 0;
                local_c60 = hash_table_new(iVar21,0);
                pmVar11 = local_c68;
                if (0 < local_c68->n_phone) {
                  lVar27 = 0;
                  lVar24 = 0;
                  val = (void *)0x0;
                  do {
                    pvVar20 = hash_table_enter_bkey
                                        (local_c60,(char *)pmVar11->sseq[lVar24],
                                         (long)(int)(uVar28 * 2),val);
                    local_838._0_1_ = (byte)pvVar20;
                    local_838._1_1_ = (char)((ulong)pvVar20 >> 8);
                    local_838._2_1_ = (undefined1)((ulong)pvVar20 >> 0x10);
                    local_838._3_1_ = (undefined1)((ulong)pvVar20 >> 0x18);
                    uVar30 = (int)val + (uint)((int)val == (int)pvVar20);
                    val = (void *)(ulong)uVar30;
                    *(int *)((long)&pmVar11->phone->ssid + lVar27) = (int)pvVar20;
                    lVar24 = lVar24 + 1;
                    lVar27 = lVar27 + 0x20;
                  } while (lVar24 < pmVar11->n_phone);
                }
                ppsVar16 = (s3senid_t **)
                           __ckd_calloc_2d__((long)(int)uVar30,(long)pmVar11->n_emit_state,2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                             ,0x277);
                g = hash_table_tolist(local_c60,(int32 *)&local_838);
                pgVar7 = g;
                if (CONCAT13(local_838._3_1_,
                             CONCAT12(local_838._2_1_,CONCAT11(local_838._1_1_,(byte)local_838))) ==
                    uVar30) {
                  for (; pgVar7 != (glist_t)0x0; pgVar7 = pgVar7->next) {
                    uVar6 = *(undefined8 *)((long)(pgVar7->data).ptr + 0x10);
                    local_838._0_1_ = (byte)uVar6;
                    local_838._1_1_ = (char)((ulong)uVar6 >> 8);
                    local_838._2_1_ = (undefined1)((ulong)uVar6 >> 0x10);
                    local_838._4_3_ = (undefined3)((uint)local_838._3_4_ >> 8);
                    local_838._3_1_ = (undefined1)((ulong)uVar6 >> 0x18);
                    memcpy(ppsVar16[(int)uVar6],*(pgVar7->data).ptr,(long)(int)(uVar28 * 2));
                  }
                  glist_free(g);
                  pmVar11 = local_c68;
                  ckd_free_2d(local_c68->sseq);
                  pmVar11->sseq = ppsVar16;
                  pmVar11->n_sseq = uVar30;
                  hash_table_free(local_c60);
                  fclose(__stream);
                  return pmVar11;
                }
                __assert_fail("j == n_sseq",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                              ,0x27a,"void sseq_compress(mdef_t *)");
              }
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                      ,0x332,"#CI-senones(%d) != #CI-phone(%d) x #emitting-states(%d)\n",
                      (ulong)(uint)pmVar11->n_ci_sen,(ulong)(uint)pmVar11->n_ciphone,
                      pmVar11->n_emit_state);
              goto LAB_00115b5c;
            }
            pcVar12 = "Header error: n_state_map not a multiple of n_ci*n_tri\n";
            lVar24 = 0x2ed;
            goto LAB_00115ae9;
          }
          uVar32 = 0x7ffffffe;
          pcVar12 = "%s: #tmats (%d) exceeds limit (%d)\n";
          lVar24 = 0x2e8;
          uVar22 = (ulong)uVar4;
        }
        else {
          uVar32 = 0x7ffe;
          pcVar12 = "%s: #senones (%d) exceeds limit (%d)\n";
          lVar24 = 0x2e5;
        }
      }
      else {
        uVar32 = 0x7ffffffe;
        pcVar12 = "%s: #Phones (%d) exceeds limit (%d)\n";
        lVar24 = 0x2e2;
        uVar22 = (ulong)uVar26;
      }
    }
    else {
      uVar32 = 0x7fff;
      pcVar12 = "%s: #CI phones (%d) exceeds limit (%d)\n";
      lVar24 = 0x2df;
      uVar22 = (ulong)size;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
            ,lVar24,pcVar12,local_c60,uVar22,uVar32);
  }
LAB_00115b5c:
  exit(1);
}

Assistant:

mdef_t *
mdef_init(const char *mdeffile, int32 breport)
{
    FILE *fp;
    int32 n_ci, n_tri, n_map, n;
    char tag[1024], buf[1024];
    s3senid_t **senmap;
    /*    s3senid_t *tempsenmap; */

    s3pid_t p;
    int32 s, ci, cd;
    mdef_t *m;

    if (!mdeffile)
        E_FATAL("No mdef-file\n");

    if (breport)
        E_INFO("Reading model definition: %s\n", mdeffile);

    m = (mdef_t *) ckd_calloc(1, sizeof(mdef_t));       /* freed in mdef_free */

    if ((fp = fopen(mdeffile, "r")) == NULL)
        E_FATAL_SYSTEM("fopen(%s,r) failed\n", mdeffile);

    if (noncomment_line(buf, sizeof(buf), fp) < 0)
        E_FATAL("Empty file: %s\n", mdeffile);

    if (strncmp(buf, MODEL_DEF_VERSION, strlen(MODEL_DEF_VERSION)) != 0)
        E_FATAL("Version error: Expecing %s, but read %s\n",
                MODEL_DEF_VERSION, buf);

    /* Read #base phones, #triphones, #senone mappings defined in header */
    n_ci = -1;
    n_tri = -1;
    n_map = -1;
    m->n_ci_sen = -1;
    m->n_sen = -1;
    m->n_tmat = -1;
    do {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Incomplete header\n");

        if ((sscanf(buf, "%d %s", &n, tag) != 2) || (n < 0))
            E_FATAL("Error in header: %s\n", buf);

        if (strcmp(tag, "n_base") == 0)
            n_ci = n;
        else if (strcmp(tag, "n_tri") == 0)
            n_tri = n;
        else if (strcmp(tag, "n_state_map") == 0)
            n_map = n;
        else if (strcmp(tag, "n_tied_ci_state") == 0)
            m->n_ci_sen = n;
        else if (strcmp(tag, "n_tied_state") == 0)
            m->n_sen = n;
        else if (strcmp(tag, "n_tied_tmat") == 0)
            m->n_tmat = n;
        else
            E_FATAL("Unknown header line: %s\n", buf);
    } while ((n_ci < 0) || (n_tri < 0) || (n_map < 0) ||
             (m->n_ci_sen < 0) || (m->n_sen < 0) || (m->n_tmat < 0));

    if ((n_ci == 0) || (m->n_ci_sen == 0) || (m->n_tmat == 0)
        || (m->n_ci_sen > m->n_sen))
        E_FATAL("%s: Error in header\n", mdeffile);

    /* Check typesize limits */
    if (n_ci >= MAX_S3CIPID)
        E_FATAL("%s: #CI phones (%d) exceeds limit (%d)\n", mdeffile, n_ci,
                MAX_S3CIPID);
    if (n_ci + n_tri >= MAX_S3PID)
        E_FATAL("%s: #Phones (%d) exceeds limit (%d)\n", mdeffile,
                n_ci + n_tri, MAX_S3PID);
    if (m->n_sen >= MAX_S3SENID)
        E_FATAL("%s: #senones (%d) exceeds limit (%d)\n", mdeffile,
                m->n_sen, MAX_S3SENID);
    if (m->n_tmat >= MAX_S3TMATID)
        E_FATAL("%s: #tmats (%d) exceeds limit (%d)\n", mdeffile,
                m->n_tmat, MAX_S3TMATID);

    m->n_emit_state = (n_map / (n_ci + n_tri)) - 1;
    if ((m->n_emit_state + 1) * (n_ci + n_tri) != n_map)
        E_FATAL
            ("Header error: n_state_map not a multiple of n_ci*n_tri\n");

    /* Initialize ciphone info */
    m->n_ciphone = n_ci;
    m->ciphone_ht = hash_table_new(n_ci, HASH_CASE_YES);  /* With case-insensitive string names *//* freed in mdef_free */
    m->ciphone = (ciphone_t *) ckd_calloc(n_ci, sizeof(ciphone_t));     /* freed in mdef_free */

    /* Initialize phones info (ciphones + triphones) */
    m->n_phone = n_ci + n_tri;
    m->phone = (phone_t *) ckd_calloc(m->n_phone, sizeof(phone_t));     /* freed in mdef_free */

    /* Allocate space for state->senone map for each phone */
    senmap = (s3senid_t **) ckd_calloc_2d(m->n_phone, m->n_emit_state, sizeof(s3senid_t));      /* freed in mdef_free */
    m->sseq = senmap;           /* TEMPORARY; until it is compressed into just the unique ones */


    /**CODE DUPLICATION!*****************************************************************************************************/
    /* Flat decoder-specific */
    /* Allocate space for state->senone map for each phone */

    /* ARCHAN 20040820, this sacrifice readability and may cause pointer
       problems in future. However, this is a less evil than
       duplication of code.  This is trick point all the state mapping
       to the global mapping and avoid duplicated memory.  
     */

    /* S3 xwdpid_compress will compress the below list phone list. 
     */

    /* ARCHAN, this part should not be used when one of the recognizer is used. */
    m->st2senmap =
        (s3senid_t *) ckd_calloc(m->n_phone * m->n_emit_state,
                                 sizeof(s3senid_t));
    for (p = 0; p < m->n_phone; p++)
        m->phone[p].state = m->st2senmap + (p * m->n_emit_state);
    /******************************************************************************************************/


    /* Allocate initial space for <ci,lc,rc,wpos> -> pid mapping */
    m->wpos_ci_lclist = (ph_lc_t ***) ckd_calloc_2d(N_WORD_POSN, m->n_ciphone, sizeof(ph_lc_t *));      /* freed in mdef_free */

    /*
     * Read base phones and triphones.  They'll simply be assigned a running sequence
     * number as their "phone-id".  If the phone-id < n_ci, it's a ciphone.
     */

    /* Read base phones */
    for (p = 0; p < n_ci; p++) {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Premature EOF reading CIphone %d\n", p);
        parse_base_line(m, buf, p);
    }
    m->sil = mdef_ciphone_id(m, S3_SILENCE_CIPHONE);

    /* Read triphones, if any */
    for (; p < m->n_phone; p++) {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Premature EOF reading phone %d\n", p);
        parse_tri_line(m, buf, p);
    }

    if (noncomment_line(buf, sizeof(buf), fp) >= 0)
        E_ERROR("Non-empty file beyond expected #phones (%d)\n",
                m->n_phone);

    /* Build CD senones to CI senones map */
    if (m->n_ciphone * m->n_emit_state != m->n_ci_sen)
        E_FATAL
            ("#CI-senones(%d) != #CI-phone(%d) x #emitting-states(%d)\n",
             m->n_ci_sen, m->n_ciphone, m->n_emit_state);
    m->cd2cisen = (s3senid_t *) ckd_calloc(m->n_sen, sizeof(s3senid_t));        /* freed in mdef_free */

    m->sen2cimap = (s3cipid_t *) ckd_calloc(m->n_sen, sizeof(s3cipid_t));       /* freed in mdef_free */

    for (s = 0; s < m->n_sen; s++)
        m->sen2cimap[s] = BAD_S3CIPID;
    for (s = 0; s < m->n_ci_sen; s++) { /* CI senones */
        m->cd2cisen[s] = (s3senid_t) s;
        m->sen2cimap[s] = s / m->n_emit_state;
    }
    for (p = n_ci; p < m->n_phone; p++) {       /* CD senones */
        for (s = 0; s < m->n_emit_state; s++) {
            cd = m->sseq[p][s];
            ci = m->sseq[(int) m->phone[p].ci][s];
            m->cd2cisen[cd] = (s3senid_t) ci;
            m->sen2cimap[cd] = m->phone[p].ci;
        }
    }

    sseq_compress(m);
    fclose(fp);

    return m;
}